

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.h
# Opt level: O2

void pstack::convert<double>(char *opt,double *to)

{
  double dVar1;
  
  dVar1 = strtod(opt,(char **)0x0);
  *to = dVar1;
  return;
}

Assistant:

void convert(const char *opt, T &to) {
   if constexpr (std::is_integral_v<T>)
      if constexpr (std::is_signed_v<T>)
          to = T(strtoll(opt, nullptr, 0));
      else
          to = T(strtoull(opt, nullptr, 0));
   else if constexpr (std::is_floating_point_v<T>)
      to = strtod(opt, nullptr);
   else
      to = opt;
}